

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDComponentPtrPair::CompareFirstPointer
              (ON_SubDComponentPtrPair *lhs,ON_SubDComponentPtrPair *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ON__UINT_PTR rhs_ptr;
  ON__UINT_PTR lhs_ptr;
  ON_SubDComponentPtrPair *rhs_local;
  ON_SubDComponentPtrPair *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (rhs == (ON_SubDComponentPtrPair *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else if (lhs == (ON_SubDComponentPtrPair *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else {
    uVar1 = lhs->m_pair[0].m_ptr & 0xfffffffffffffff8;
    uVar2 = rhs->m_pair[0].m_ptr & 0xfffffffffffffff8;
    if (uVar1 < uVar2) {
      lhs_local._4_4_ = -1;
    }
    else if (uVar2 < uVar1) {
      lhs_local._4_4_ = 1;
    }
    else {
      lhs_local._4_4_ = 0;
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDComponentPtrPair::CompareFirstPointer(
  const ON_SubDComponentPtrPair* lhs,
  const ON_SubDComponentPtrPair* rhs
)
{
  if (lhs == rhs)
    return 0;
  // nulls sort to end.
  if (nullptr == rhs)
    return -1;
  if (nullptr == lhs)
    return 1;
  const ON__UINT_PTR lhs_ptr = (ON_SUBD_COMPONENT_POINTER_MASK & lhs->m_pair[0].m_ptr);
  const ON__UINT_PTR rhs_ptr = (ON_SUBD_COMPONENT_POINTER_MASK & rhs->m_pair[0].m_ptr);
  if (lhs_ptr < rhs_ptr)
    return -1;
  if (lhs_ptr > rhs_ptr)
    return 1;
  return 0;
}